

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxu32 BinHash(void *pSrc,sxu32 nLen)

{
  sxu32 sVar1;
  byte *pbVar2;
  uchar *zIn;
  
  if (nLen == 0) {
    return 0x1505;
  }
  pbVar2 = (byte *)((ulong)nLen + (long)pSrc);
  sVar1 = 0x1505;
  do {
    sVar1 = (uint)*pSrc + sVar1 * 0x21;
    if (pbVar2 <= (byte *)((long)pSrc + 1)) {
      return sVar1;
    }
    sVar1 = (uint)*(byte *)((long)pSrc + 1) + sVar1 * 0x21;
    if (pbVar2 <= (byte *)((long)pSrc + 2)) {
      return sVar1;
    }
    sVar1 = (uint)*(byte *)((long)pSrc + 2) + sVar1 * 0x21;
    if (pbVar2 <= (byte *)((long)pSrc + 3)) {
      return sVar1;
    }
    sVar1 = (uint)*(byte *)((long)pSrc + 3) + sVar1 * 0x21;
    pSrc = (void *)((long)pSrc + 4);
  } while (pSrc < pbVar2);
  return sVar1;
}

Assistant:

static sxu32 BinHash(const void *pSrc, sxu32 nLen)
{
	register unsigned char *zIn = (unsigned char *)pSrc;
	unsigned char *zEnd;
	sxu32 nH = 5381;
	zEnd = &zIn[nLen];
	for(;;){
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
		if( zIn >= zEnd ){ break; } nH = nH * 33 + zIn[0] ; zIn++;
	}	
	return nH;
}